

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

bool __thiscall
capnp::_::StructReader::isCanonical
          (StructReader *this,word **readHead,word **ptrHead,bool *dataTrunc,bool *ptrTrunc)

{
  bool bVar1;
  StructDataBitCount SVar2;
  word *pwVar3;
  NullableValue<unsigned_int> *pNVar4;
  uint *puVar5;
  unsigned_long uVar6;
  unsigned_short *puVar7;
  PointerReader local_c8;
  ushort local_a2;
  Iterator local_a0;
  Iterator local_9e;
  Range<unsigned_short> RStack_9c;
  unsigned_short ptrIndex;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  Maybe<unsigned_int> local_6c;
  NullableValue<unsigned_int> local_64;
  NullableValue<unsigned_int> diff_1;
  Maybe<unsigned_int> local_4c;
  NullableValue<unsigned_int> local_44;
  NullableValue<unsigned_int> diff;
  uint dataSize;
  bool *ptrTrunc_local;
  bool *dataTrunc_local;
  word **ptrHead_local;
  word **readHead_local;
  StructReader *this_local;
  
  unique0x100002e2 = ptrTrunc;
  pwVar3 = (word *)getLocation(this);
  if (pwVar3 == *readHead) {
    SVar2 = getDataSectionSize(this);
    if ((SVar2 & 0x3f) == 0) {
      SVar2 = getDataSectionSize(this);
      diff._0_4_ = SVar2 >> 6;
      trySubtract<unsigned_int,unsigned_int>((capnp *)&local_4c,diff._0_4_,1);
      pNVar4 = kj::_::readMaybe<unsigned_int>(&local_4c);
      kj::_::NullableValue<unsigned_int>::NullableValue(&local_44,pNVar4);
      kj::Maybe<unsigned_int>::~Maybe(&local_4c);
      puVar5 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_44);
      if (puVar5 == (uint *)0x0) {
        *dataTrunc = true;
      }
      else {
        puVar5 = kj::_::NullableValue<unsigned_int>::operator*(&local_44);
        uVar6 = getDataField<unsigned_long>(this,*puVar5);
        *dataTrunc = uVar6 != 0;
      }
      kj::_::NullableValue<unsigned_int>::~NullableValue(&local_44);
      trySubtract<unsigned_short,unsigned_int>((capnp *)&local_6c,this->pointerCount,1);
      pNVar4 = kj::_::readMaybe<unsigned_int>(&local_6c);
      kj::_::NullableValue<unsigned_int>::NullableValue(&local_64,pNVar4);
      kj::Maybe<unsigned_int>::~Maybe(&local_6c);
      puVar5 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_64);
      if (puVar5 == (uint *)0x0) {
        *stack0xffffffffffffffc8 = true;
      }
      else {
        puVar5 = kj::_::NullableValue<unsigned_int>::operator*(&local_64);
        getPointerField((PointerReader *)&__range2,this,*puVar5);
        bVar1 = PointerReader::isNull((PointerReader *)&__range2);
        *stack0xffffffffffffffc8 = (bool)((bVar1 ^ 0xffU) & 1);
      }
      kj::_::NullableValue<unsigned_int>::~NullableValue(&local_64);
      *readHead = *readHead + (diff._0_4_ + (uint)this->pointerCount);
      RStack_9c = kj::zeroTo<unsigned_short>(this->pointerCount);
      ___end2 = &stack0xffffffffffffff64;
      local_9e = kj::Range<unsigned_short>::begin(___end2);
      local_a0 = kj::Range<unsigned_short>::end(___end2);
      while (bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_9e,&local_a0), bVar1) {
        puVar7 = kj::Range<unsigned_short>::Iterator::operator*(&local_9e);
        local_a2 = *puVar7;
        getPointerField(&local_c8,this,(uint)local_a2);
        bVar1 = PointerReader::isCanonical(&local_c8,ptrHead);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        kj::Range<unsigned_short>::Iterator::operator++(&local_9e);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StructReader::isCanonical(const word **readHead,
                               const word **ptrHead,
                               bool *dataTrunc,
                               bool *ptrTrunc) {
  if (this->getLocation() != *readHead) {
    // Our target area is not at the readHead, preorder fails
    return false;
  }

  if (this->getDataSectionSize() % BITS_PER_WORD != ZERO * BITS) {
    // Using legacy non-word-size structs, reject
    return false;
  }
  auto dataSize = this->getDataSectionSize() / BITS_PER_WORD;

  // Mark whether the struct is properly truncated
  KJ_IF_MAYBE(diff, trySubtract(dataSize, ONE * WORDS)) {
    *dataTrunc = this->getDataField<uint64_t>(*diff / WORDS * ELEMENTS) != 0;
  } else {
    // Data segment empty.
    *dataTrunc = true;
  }